

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O2

void array_delete<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
               (Entry *array,size_t length)

{
  Entry *this;
  bool bVar1;
  
  this = array + length;
  while( true ) {
    this = this + -1;
    bVar1 = length == 0;
    length = length - 1;
    if (bVar1) break;
    Lib::
    Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Bucket,_Lib::DefaultHash>
    ::Entry::~Entry(this);
  }
  return;
}

Assistant:

void array_delete(T* array, size_t length)
{
  ASS_NEQ(array,0);
  ASS_G(length,0);

  array+=length;
  while(length--) {
    (--array)->~T();
  }
}